

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O2

void duckdb::BitpackingPrimitives::SignExtend<signed_char,unsigned_char>
               (data_ptr_t dst,bitpacking_width_t width)

{
  byte bVar1;
  idx_t i;
  long lVar2;
  
  i._0_1_ = width - 1;
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    bVar1 = (byte)(1 << ((byte)i & 0x1f));
    dst[lVar2] = (dst[lVar2] & ~(byte)(-1 << (width & 0x1f)) ^ bVar1) - bVar1;
  }
  return;
}

Assistant:

static void SignExtend(data_ptr_t dst, bitpacking_width_t width) {
		T const mask = UnsafeNumericCast<T>(T_U(1) << (width - 1));
		for (idx_t i = 0; i < BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE; ++i) {
			T value = Load<T>(dst + i * sizeof(T));
			value = UnsafeNumericCast<T>(T_U(value) & ((T_U(1) << width) - T_U(1)));
			T result = (value ^ mask) - mask;
			Store(result, dst + i * sizeof(T));
		}
	}